

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void hts_idx_finish(hts_idx_t *idx,uint64_t final_offset)

{
  bins_t *pbVar1;
  uint64_t *puVar2;
  kh_bin_t *pkVar3;
  uint64_t uVar4;
  bidx_t *pbVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  khint_t kVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  hts_pair64_t *phVar14;
  hts_pair64_t *phVar15;
  long lVar16;
  byte bVar17;
  int32_t iVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  bins_t *pbVar30;
  bool bVar31;
  int absent;
  int absent_1;
  int absent_2;
  uint local_84;
  ulong local_78;
  uint local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((idx == (hts_idx_t *)0x0) || ((idx->z).finished != 0)) {
    return;
  }
  lVar13 = (long)(idx->z).save_tid;
  if (-1 < lVar13) {
    pkVar3 = idx->bidx[lVar13];
    uVar4 = (idx->z).save_off;
    kVar9 = kh_put_bin(pkVar3,(idx->z).save_bin,&local_3c);
    pbVar30 = pkVar3->vals + kVar9;
    if (local_3c == 0) {
      iVar18 = pbVar30->n;
      if (iVar18 == pbVar30->m) {
        pbVar30->m = iVar18 * 2;
        phVar14 = (hts_pair64_t *)realloc(pbVar30->list,(long)(iVar18 * 2) << 4);
        pbVar30->list = phVar14;
        iVar18 = pbVar30->n;
      }
      else {
        phVar14 = pbVar30->list;
      }
    }
    else {
      pbVar30->m = 1;
      pbVar30->n = 0;
      phVar14 = (hts_pair64_t *)calloc(1,0x10);
      pbVar30->list = phVar14;
      iVar18 = 0;
    }
    phVar14[iVar18].u = uVar4;
    pbVar30->n = iVar18 + 1;
    phVar14[iVar18].v = final_offset;
    pkVar3 = idx->bidx[(idx->z).save_tid];
    uVar4 = (idx->z).off_beg;
    kVar9 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_38);
    pbVar30 = pkVar3->vals + kVar9;
    if (local_38 == 0) {
      iVar18 = pbVar30->n;
      if (iVar18 == pbVar30->m) {
        pbVar30->m = iVar18 * 2;
        phVar14 = (hts_pair64_t *)realloc(pbVar30->list,(long)(iVar18 * 2) << 4);
        pbVar30->list = phVar14;
        iVar18 = pbVar30->n;
      }
      else {
        phVar14 = pbVar30->list;
      }
    }
    else {
      pbVar30->m = 1;
      pbVar30->n = 0;
      phVar14 = (hts_pair64_t *)calloc(1,0x10);
      pbVar30->list = phVar14;
      iVar18 = 0;
    }
    phVar14[iVar18].u = uVar4;
    pbVar30->n = iVar18 + 1;
    phVar14[iVar18].v = final_offset;
    pkVar3 = idx->bidx[(idx->z).save_tid];
    uVar4 = (idx->z).n_mapped;
    uVar8 = (idx->z).n_unmapped;
    kVar9 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_34);
    pbVar30 = pkVar3->vals + kVar9;
    if (local_34 == 0) {
      iVar18 = pbVar30->n;
      if (iVar18 == pbVar30->m) {
        pbVar30->m = iVar18 * 2;
        phVar14 = (hts_pair64_t *)realloc(pbVar30->list,(long)(iVar18 * 2) << 4);
        pbVar30->list = phVar14;
        iVar18 = pbVar30->n;
      }
      else {
        phVar14 = pbVar30->list;
      }
    }
    else {
      pbVar30->m = 1;
      pbVar30->n = 0;
      phVar14 = (hts_pair64_t *)calloc(1,0x10);
      pbVar30->list = phVar14;
      iVar18 = 0;
    }
    pbVar30->n = iVar18 + 1;
    phVar14[iVar18].u = uVar4;
    phVar14[iVar18].v = uVar8;
  }
  if (0 < idx->n) {
    lVar13 = 0;
    do {
      update_loff(idx,(int)lVar13,(uint)(idx->fmt == 0));
      pbVar5 = idx->bidx[lVar13];
      if (pbVar5 != (bidx_t *)0x0) {
        uVar26 = pbVar5->n_buckets;
        local_84 = uVar26;
        if (idx->n_lvls < 1) {
          uVar22 = (ulong)uVar26;
        }
        else {
          local_78 = (ulong)uVar26;
          uVar22 = (ulong)uVar26;
          uVar11 = uVar26;
          iVar21 = idx->n_lvls;
          do {
            bVar31 = uVar26 != 0;
            uVar26 = 0;
            if (bVar31) {
              uVar19 = 0;
              do {
                uVar6 = (uint)uVar19;
                uVar26 = uVar6 * 2 & 0x1e;
                uVar29 = 3 << (sbyte)uVar26;
                uVar7 = uVar19 >> 4;
                if ((((pbVar5->flags[uVar7] & uVar29) == 0) &&
                    (pbVar5->keys[uVar19] < (uint)idx->n_bins)) &&
                   (local_48 = (uint)((ulong)(uint)~(-1 << ((char)iVar21 * '\x03' & 0x1fU)) *
                                      0x92492493 >> 0x22), local_48 <= pbVar5->keys[uVar19])) {
                  pbVar30 = pbVar5->vals;
                  if ((iVar21 < idx->n_lvls) && (1 < (long)pbVar30[uVar19].n)) {
                    ks_introsort__off((long)pbVar30[uVar19].n,pbVar30[uVar19].list);
                    local_84 = pbVar5->n_buckets;
                    local_78 = (ulong)local_84;
                  }
                  phVar14 = pbVar30[uVar19].list;
                  lVar16 = (long)pbVar30[uVar19].n;
                  uVar11 = (uint)local_78;
                  uVar22 = local_78;
                  if ((phVar14[lVar16 + -1].v >> 0x10) - (phVar14->u >> 0x10) < 0x10000) {
                    if (uVar11 == 0) {
                      uVar27 = 0;
LAB_0010d056:
                      if ((uint)uVar27 != uVar11) {
                        pbVar1 = pbVar5->vals + uVar27;
                        iVar12 = pbVar1->n;
                        iVar10 = iVar12 + pbVar30[uVar19].n;
                        if (pbVar1->m < iVar10) {
                          uVar11 = iVar10 - 1;
                          uVar11 = (int)uVar11 >> 1 | uVar11;
                          uVar11 = (int)uVar11 >> 2 | uVar11;
                          uVar11 = (int)uVar11 >> 4 | uVar11;
                          uVar11 = (int)uVar11 >> 8 | uVar11;
                          uVar11 = (int)uVar11 >> 0x10 | uVar11;
                          pbVar1->m = uVar11 + 1;
                          phVar15 = (hts_pair64_t *)
                                    realloc(pbVar1->list,(long)(int)uVar11 * 0x10 + 0x10);
                          pbVar1->list = phVar15;
                          iVar12 = pbVar1->n;
                          phVar14 = pbVar30[uVar19].list;
                          lVar16 = (long)pbVar30[uVar19].n;
                        }
                        else {
                          phVar15 = pbVar1->list;
                        }
                        memcpy(phVar15 + iVar12,phVar14,lVar16 << 4);
                        pbVar1->n = pbVar1->n + pbVar30[uVar19].n;
                        free(pbVar30[uVar19].list);
                        uVar25 = pbVar5->n_buckets;
                        uVar22 = uVar19;
                        uVar11 = uVar6;
                        local_84 = uVar6;
                        local_78 = uVar19;
                        if (uVar25 != uVar6) {
                          uVar24 = pbVar5->flags[uVar7];
                          local_78 = (ulong)uVar25;
                          uVar22 = local_78;
                          uVar11 = uVar25;
                          local_84 = uVar25;
                          if ((uVar24 & uVar29) == 0) {
                            pbVar5->flags[uVar7] = uVar24 | 1 << uVar26;
                            pbVar5->size = pbVar5->size - 1;
                            uVar11 = pbVar5->n_buckets;
                            local_78 = (ulong)uVar11;
                            uVar22 = (ulong)uVar11;
                            local_84 = uVar11;
                          }
                        }
                      }
                    }
                    else {
                      uVar24 = pbVar5->keys[uVar19] - 1 >> 3;
                      uVar28 = uVar24 & uVar11 - 1;
                      iVar12 = 1;
                      uVar25 = uVar28;
                      do {
                        bVar17 = (char)uVar25 * '\x02' & 0x1e;
                        uVar20 = pbVar5->flags[uVar25 >> 4] >> bVar17;
                        if (((uVar20 & 2) != 0) ||
                           (((uVar20 & 1) == 0 && (pbVar5->keys[uVar25] == uVar24)))) {
                          uVar27 = (ulong)uVar25;
                          if ((pbVar5->flags[uVar25 >> 4] >> bVar17 & 3) != 0) {
                            uVar27 = local_78;
                          }
                          goto LAB_0010d056;
                        }
                        uVar25 = uVar25 + iVar12 & uVar11 - 1;
                        iVar12 = iVar12 + 1;
                      } while (uVar25 != uVar28);
                    }
                  }
                }
                uVar19 = (ulong)(uVar6 + 1);
                uVar26 = uVar11;
              } while (uVar6 + 1 != uVar11);
            }
            bVar31 = 1 < iVar21;
            iVar21 = iVar21 + -1;
          } while (bVar31);
        }
        iVar21 = (int)uVar22;
        if (iVar21 == 0) {
          uVar19 = 0;
LAB_0010d200:
          if ((int)uVar19 != iVar21) {
            ks_introsort__off((long)pbVar5->vals[uVar19].n,pbVar5->vals[uVar19].list);
            local_84 = pbVar5->n_buckets;
            uVar22 = (ulong)local_84;
          }
        }
        else {
          uVar19 = 0;
          iVar12 = 1;
          do {
            bVar17 = (char)uVar19 * '\x02' & 0x1e;
            uVar26 = pbVar5->flags[uVar19 >> 4] >> bVar17;
            if (((uVar26 & 2) != 0) || (((uVar26 & 1) == 0 && (pbVar5->keys[uVar19] == 0)))) {
              if ((pbVar5->flags[uVar19 >> 4] >> bVar17 & 3) != 0) {
                uVar19 = uVar22;
              }
              goto LAB_0010d200;
            }
            uVar26 = (int)uVar19 + iVar12;
            iVar12 = iVar12 + 1;
            uVar26 = uVar26 & iVar21 - 1U;
            uVar19 = (ulong)uVar26;
          } while (uVar26 != 0);
        }
        if ((int)uVar22 != 0) {
          uVar19 = 0;
          do {
            if (((pbVar5->flags[uVar19 >> 4] >> ((char)uVar19 * '\x02' & 0x1fU) & 3) == 0) &&
               (pbVar5->keys[uVar19] < (uint)idx->n_bins)) {
              pbVar30 = pbVar5->vals;
              iVar21 = pbVar30[uVar19].n;
              iVar12 = 1;
              if (1 < iVar21) {
                iVar12 = 0;
                lVar16 = 1;
                lVar23 = 0x10;
                do {
                  phVar14 = pbVar30[uVar19].list;
                  if (phVar14[iVar12].v >> 0x10 < *(ulong *)((long)&phVar14->u + lVar23) >> 0x10) {
                    puVar2 = (uint64_t *)((long)&phVar14->u + lVar23);
                    uVar4 = puVar2[1];
                    phVar14[(long)iVar12 + 1].u = *puVar2;
                    phVar14[(long)iVar12 + 1].v = uVar4;
                    iVar21 = pbVar30[uVar19].n;
                    iVar12 = iVar12 + 1;
                  }
                  else {
                    uVar22 = *(ulong *)((long)&phVar14->v + lVar23);
                    if (phVar14[iVar12].v < uVar22) {
                      phVar14[iVar12].v = uVar22;
                    }
                  }
                  lVar16 = lVar16 + 1;
                  lVar23 = lVar23 + 0x10;
                } while (lVar16 < iVar21);
                local_84 = pbVar5->n_buckets;
                iVar12 = iVar12 + 1;
              }
              pbVar30[uVar19].n = iVar12;
              uVar22 = (ulong)local_84;
            }
            uVar26 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar26;
          } while (uVar26 != (uint)uVar22);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < idx->n);
  }
  (idx->z).finished = 1;
  return;
}

Assistant:

void hts_idx_finish(hts_idx_t *idx, uint64_t final_offset)
{
    int i;
    if (idx == NULL || idx->z.finished) return; // do not run this function on an empty index or multiple times
    if (idx->z.save_tid >= 0) {
        insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, final_offset);
        insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
    }
    for (i = 0; i < idx->n; ++i) {
        update_loff(idx, i, (idx->fmt == HTS_FMT_CSI));
        compress_binning(idx, i);
    }
    idx->z.finished = 1;
}